

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O0

float trng::math::detail::Beta_I<float>(float x,float p,float q,float norm)

{
  bool bVar1;
  float fVar2;
  int *piVar3;
  float *in_RDI;
  float in_XMM0_Da;
  float extraout_XMM0_Da;
  float fVar4;
  float fVar5;
  double dVar6;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  int s;
  float temp;
  float rx;
  float y;
  float i;
  float term;
  bool flag;
  float cx;
  float psq;
  float eps;
  float local_4c;
  int local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  float local_8;
  float local_4;
  
  if ((((in_XMM1_Da <= 0.0) || (in_XMM2_Da <= 0.0)) || (in_XMM0_Da < 0.0)) || (1.0 < in_XMM0_Da)) {
    piVar3 = __errno_location();
    *piVar3 = 0x21;
    local_4 = std::numeric_limits<float>::quiet_NaN();
  }
  else {
    local_14 = in_XMM3_Da;
    local_10 = in_XMM2_Da;
    local_c = in_XMM1_Da;
    local_8 = in_XMM0_Da;
    local_18 = Catch::clara::std::numeric_limits<float>::epsilon();
    local_18 = local_18 * 4.0;
    local_1c = local_c + local_10;
    local_20 = 1.0 - local_8;
    bVar1 = local_c < local_1c * local_8;
    if (bVar1) {
      utility::swap<float>(&local_8,&local_20);
      in_RDI = &local_c;
      utility::swap<float>(in_RDI,&local_10);
    }
    local_28 = 1.0;
    local_2c = 1.0;
    local_30 = 1.0;
    local_34 = local_8 / local_20;
    local_38 = local_10 - 1.0;
    local_3c = (int)(local_20 * local_1c + local_10);
    if (local_3c == 0) {
      local_34 = local_8;
    }
    while( true ) {
      local_28 = ((local_38 * local_34) / (local_c + local_2c)) * local_28;
      local_30 = local_28 + local_30;
      Catch::clara::std::abs((int)in_RDI);
      fVar2 = local_c;
      if ((extraout_XMM0_Da <= 4.7683716e-07) && (extraout_XMM0_Da <= local_30 * 4.7683716e-07))
      break;
      local_2c = local_2c + 1.0;
      local_3c = local_3c + -1;
      if (local_3c < 0) {
        local_38 = local_1c;
        local_1c = local_1c + 1.0;
      }
      else {
        local_38 = local_10 - local_2c;
        if (local_3c == 0) {
          local_34 = local_8;
        }
      }
    }
    fVar4 = ln(0.0);
    fVar5 = ln(0.0);
    dVar6 = std::exp((double)(ulong)(uint)(fVar2 * fVar4 + (local_10 - 1.0) * fVar5));
    local_4c = ((SUB84(dVar6,0) / local_c) / local_14) * local_30;
    if (bVar1) {
      local_4c = 1.0 - local_4c;
    }
    local_4 = local_4c;
  }
  return local_4;
}

Assistant:

TRNG_CUDA_ENABLE T Beta_I(T x, T p, T q, T norm) {
        if (p <= 0 or q <= 0 or x < 0 or x > 1) {
#if !(defined TRNG_CUDA)
          errno = EDOM;
#endif
          return numeric_limits<T>::quiet_NaN();
        }
        const T eps{4 * numeric_limits<T>::epsilon()};
        T psq{p + q}, cx{1 - x};
        const bool flag{p < psq * x};
        if (flag) {
          // use  I(x, p, q) = 1 - I(1 - x, q, p)
          utility::swap(x, cx);
          utility::swap(p, q);
        }
        T term{1}, i{1}, y{1}, rx{x / cx}, temp{q - i};
        int s{static_cast<int>(q + cx * psq)};
        if (s == 0)
          rx = x;
        while (true) {
          term *= temp * rx / (p + i);
          y += term;
          temp = abs(term);
          if (temp <= eps and temp <= eps * y)
            break;
          ++i;
          --s;
          if (s >= 0) {
            temp = q - i;
            if (s == 0)
              rx = x;
          } else {
            temp = psq;
            psq++;
          }
        }
        y *= exp(p * ln(x) + (q - 1) * ln(cx)) / p / norm;
        return flag ? 1 - y : y;
      }